

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5AllocateSegid(Fts5Index *p,Fts5Structure *pStruct)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  long lVar9;
  long in_FS_OFFSET;
  uint local_128 [66];
  long local_20;
  
  puVar7 = local_128;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if (p->rc == 0) {
    if (pStruct->nSegment < 2000) {
      memset(local_128,0,0xfc);
      uVar3 = (ulong)(uint)pStruct->nLevel;
      if (pStruct->nLevel < 1) {
        uVar3 = 0;
      }
      for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
        uVar4 = pStruct->aLevel[uVar8].nSeg;
        uVar5 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar5 = 0;
        }
        for (lVar9 = 0; uVar5 * 0x38 - lVar9 != 0; lVar9 = lVar9 + 0x38) {
          uVar4 = *(int *)((long)&(pStruct->aLevel[uVar8].aSeg)->iSegid + lVar9) - 1;
          if (uVar4 < 2000) {
            local_128[uVar4 >> 5] = local_128[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
          }
        }
      }
      iVar2 = -0x20;
      do {
        uVar4 = *puVar7;
        iVar2 = iVar2 + 0x20;
        puVar7 = puVar7 + 1;
      } while (uVar4 == 0xffffffff);
      uVar6 = 0;
      do {
        iVar2 = iVar2 + 1;
        uVar1 = uVar6 & 0x1f;
        uVar6 = uVar6 + 1;
      } while ((uVar4 >> uVar1 & 1) != 0);
    }
    else {
      p->rc = 0xd;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5AllocateSegid(Fts5Index *p, Fts5Structure *pStruct){
  int iSegid = 0;

  if( p->rc==SQLITE_OK ){
    if( pStruct->nSegment>=FTS5_MAX_SEGMENT ){
      p->rc = SQLITE_FULL;
    }else{
      /* FTS5_MAX_SEGMENT is currently defined as 2000. So the following
      ** array is 63 elements, or 252 bytes, in size.  */
      u32 aUsed[(FTS5_MAX_SEGMENT+31) / 32];
      int iLvl, iSeg;
      int i;
      u32 mask;
      memset(aUsed, 0, sizeof(aUsed));
      for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          int iId = pStruct->aLevel[iLvl].aSeg[iSeg].iSegid;
          if( iId<=FTS5_MAX_SEGMENT && iId>0 ){
            aUsed[(iId-1) / 32] |= (u32)1 << ((iId-1) % 32);
          }
        }
      }

      for(i=0; aUsed[i]==0xFFFFFFFF; i++);
      mask = aUsed[i];
      for(iSegid=0; mask & ((u32)1 << iSegid); iSegid++);
      iSegid += 1 + i*32;

#ifdef SQLITE_DEBUG
      for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          assert_nc( iSegid!=pStruct->aLevel[iLvl].aSeg[iSeg].iSegid );
        }
      }
      assert_nc( iSegid>0 && iSegid<=FTS5_MAX_SEGMENT );

      {
        sqlite3_stmt *pIdxSelect = fts5IdxSelectStmt(p);
        if( p->rc==SQLITE_OK ){
          u8 aBlob[2] = {0xff, 0xff};
          sqlite3_bind_int(pIdxSelect, 1, iSegid);
          sqlite3_bind_blob(pIdxSelect, 2, aBlob, 2, SQLITE_STATIC);
          assert_nc( sqlite3_step(pIdxSelect)!=SQLITE_ROW );
          p->rc = sqlite3_reset(pIdxSelect);
          sqlite3_bind_null(pIdxSelect, 2);
        }
      }
#endif
    }
  }

  return iSegid;
}